

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall icu_63::TailoredSet::addContractions(TailoredSet *this,UChar32 c,UChar *p)

{
  UBool UVar1;
  Iterator suffixes;
  ConstChar16Ptr local_b8;
  UChar *local_b0;
  Iterator local_a0;
  
  local_b8.p_ = p;
  UCharsTrie::Iterator::Iterator(&local_a0,&local_b8,0,&this->errorCode);
  local_b0 = local_b8.p_;
  while( true ) {
    UVar1 = UCharsTrie::Iterator::next(&local_a0,&this->errorCode);
    if (UVar1 == '\0') break;
    addSuffix(this,c,&local_a0.str_);
  }
  UCharsTrie::Iterator::~Iterator(&local_a0);
  return;
}

Assistant:

void
TailoredSet::addContractions(UChar32 c, const UChar *p) {
    UCharsTrie::Iterator suffixes(p, 0, errorCode);
    while(suffixes.next(errorCode)) {
        addSuffix(c, suffixes.getString());
    }
}